

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O2

void __thiscall Hand::getFarthestFinger(Hand *this)

{
  pointer pFVar1;
  Finger *f;
  pointer pFVar2;
  double dVar3;
  Finger ff;
  double local_88;
  Point local_80;
  Point local_78;
  Finger local_70;
  
  Finger::Finger(&local_70);
  pFVar2 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar1 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = -1.0;
  for (; pFVar2 != pFVar1; pFVar2 = pFVar2 + 1) {
    local_78 = pFVar2->ptStart;
    local_80 = pFVar2->ptFar;
    dVar3 = getDist(&local_78,&local_80);
    if (local_88 < dVar3) {
      Finger::operator=(&local_70,pFVar2);
      local_88 = dVar3;
    }
  }
  Finger::operator=(&this->farthestFinger,&local_70);
  return;
}

Assistant:

void Hand::getFarthestFinger() {
    double farthest = -1;
    double dist;
    Finger ff;
    for (Finger &f : fingers) {
        dist = getDist(f.ptStart, f.ptFar);
        if (dist > farthest) {
            farthest = dist;
            ff = f;
        }
    }
    farthestFinger = ff;
}